

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testparser.c
# Opt level: O0

int testWriterClose(void)

{
  uint uVar1;
  undefined8 uVar2;
  uint local_1c;
  int result;
  int err;
  xmlTextWriterPtr writer;
  xmlOutputBufferPtr out;
  
  uVar2 = xmlOutputBufferCreateIO(testWriterIOWrite,testWriterIOClose,0);
  uVar2 = xmlNewTextWriter(uVar2);
  xmlTextWriterStartDocument(uVar2,"1.0","UTF-8",0);
  xmlTextWriterStartElement(uVar2,"elem");
  xmlTextWriterEndElement(uVar2);
  xmlTextWriterEndDocument(uVar2);
  uVar1 = xmlTextWriterClose(uVar2);
  if (uVar1 != 0x5f1) {
    fprintf(_stderr,"xmlTextWriterClose reported wrong error %d\n",(ulong)uVar1);
  }
  local_1c = (uint)(uVar1 != 0x5f1);
  xmlFreeTextWriter(uVar2);
  return local_1c;
}

Assistant:

static int
testWriterClose(void){
    xmlOutputBufferPtr out;
    xmlTextWriterPtr writer;
    int err = 0;
    int result;

    out = xmlOutputBufferCreateIO(testWriterIOWrite, testWriterIOClose,
                                  NULL, NULL);
    writer = xmlNewTextWriter(out);
    xmlTextWriterStartDocument(writer, "1.0", "UTF-8", NULL);
    xmlTextWriterStartElement(writer, BAD_CAST "elem");
    xmlTextWriterEndElement(writer);
    xmlTextWriterEndDocument(writer);
    result = xmlTextWriterClose(writer);

    if (result != XML_IO_ENAMETOOLONG) {
        fprintf(stderr, "xmlTextWriterClose reported wrong error %d\n",
                result);
        err = 1;
    }

    xmlFreeTextWriter(writer);
    return err;
}